

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV4MeshBonesVertices(Parser *this,uint iNumVertices,Mesh *mesh)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  reference this_00;
  pair<int,_float> local_3c;
  pair<int,_float> pairOut;
  ai_real afVert [3];
  uint iIndex;
  int iDepth;
  Mesh *mesh_local;
  uint iNumVertices_local;
  Parser *this_local;
  
  afVert[2] = 0.0;
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
            (&mesh->mBoneVertices,(ulong)iNumVertices);
LAB_00637927:
  do {
    if (*this->filePtr != '*') {
LAB_00637a4a:
      if (*this->filePtr == '{') {
        afVert[2] = (ai_real)((int)afVert[2] + 1);
      }
      else if (*this->filePtr == '}') {
        afVert[2] = (ai_real)((int)afVert[2] + -1);
        if (afVert[2] == 0.0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_VERTEX chunk (Level 4)"
                );
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
      goto LAB_00637927;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_VERTEX",0x10);
    if (!bVar1) goto LAB_00637a4a;
    afVert[1] = (ai_real)strtoul10(this->filePtr,&this->filePtr);
    sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh);
    if (sVar2 <= (uint)afVert[1]) {
      sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh);
      afVert[1] = (ai_real)((int)sVar2 + -1);
      LogWarning(this,
                 "Bone vertex index is out of bounds. Using the largest valid bone vertex index instead"
                );
    }
    ParseLV4MeshFloatTriple(this,(ai_real *)&pairOut);
    std::pair<int,_float>::pair<int,_float,_true>(&local_3c);
    while (bVar1 = SkipSpaces<char>(&this->filePtr), bVar1) {
      local_3c.first = strtoul10(this->filePtr,&this->filePtr);
      bVar1 = SkipSpaces<char>(&this->filePtr);
      if (!bVar1) break;
      pcVar3 = fast_atoreal_move<float>(this->filePtr,&local_3c.second,true);
      this->filePtr = pcVar3;
      if (local_3c.first != 0xffffffff) {
        this_00 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
                  operator[](&mesh->mBoneVertices,(ulong)(uint)afVert[1]);
        std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::push_back
                  (&this_00->mBoneWeights,&local_3c);
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBonesVertices(unsigned int iNumVertices,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBoneVertices.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone vertex
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX" ,16))
            {
                // read the vertex index
                unsigned int iIndex = strtoul10(filePtr,&filePtr);
                if (iIndex >= mesh.mPositions.size())
                {
                    iIndex = (unsigned int)mesh.mPositions.size()-1;
                    LogWarning("Bone vertex index is out of bounds. Using the largest valid "
                        "bone vertex index instead");
                }

                // --- ignored
                ai_real afVert[3];
                ParseLV4MeshFloatTriple(afVert);

                std::pair<int,float> pairOut;
                while (true)
                {
                    // first parse the bone index ...
                    if (!SkipSpaces(&filePtr))break;
                    pairOut.first = strtoul10(filePtr,&filePtr);

                    // then parse the vertex weight
                    if (!SkipSpaces(&filePtr))break;
                    filePtr = fast_atoreal_move<float>(filePtr,pairOut.second);

                    // -1 marks unused entries
                    if (-1 != pairOut.first)
                    {
                        mesh.mBoneVertices[iIndex].mBoneWeights.push_back(pairOut);
                    }
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("4","*MESH_BONE_VERTEX");
    }
    return;
}